

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void get_limit_dual(uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,uint8_t *_blimit1,
                   uint8_t *_limit1,uint8_t *_thresh1,int bd,__m128i *blt_out,__m128i *lt_out,
                   __m128i *thr_out,__m128i *t80_out)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined2 uVar5;
  uint uVar6;
  __m128i alVar7;
  undefined8 local_258;
  byte local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined1 uStack_147;
  undefined1 uStack_146;
  undefined1 uStack_145;
  byte local_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  byte local_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  __m128i x1;
  __m128i x0;
  __m128i zero;
  int shift;
  uint8_t *_thresh1_local;
  uint8_t *_limit1_local;
  uint8_t *_blimit1_local;
  uint8_t *_thresh0_local;
  uint8_t *_limit0_local;
  uint8_t *_blimit0_local;
  
  uVar6 = bd - 8;
  uVar1 = *(undefined8 *)_blimit0;
  uStack_c7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_c6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_c5 = (undefined1)((ulong)uVar1 >> 0x18);
  local_258._0_2_ = (ushort)(byte)uVar1;
  local_258._0_3_ = CONCAT12(uStack_c7,(ushort)local_258);
  local_258._0_4_ = (uint)(uint3)local_258;
  local_258._0_5_ = CONCAT14(uStack_c6,(uint)local_258);
  local_258._0_6_ = (uint6)(uint5)local_258;
  local_258._0_7_ = CONCAT16(uStack_c5,(uint6)local_258);
  local_258 = CONCAT17(0,(uint7)local_258);
  uVar1 = *(undefined8 *)_blimit1;
  local_e8 = (byte)uVar1;
  uStack_e7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_e6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_e5 = (undefined1)((ulong)uVar1 >> 0x18);
  auVar4[9] = 0;
  auVar4[8] = local_e8;
  auVar4[10] = uStack_e7;
  auVar4[0xb] = 0;
  auVar4[0xc] = uStack_e6;
  auVar4[0xd] = 0;
  auVar4[0xe] = uStack_e5;
  auVar4._0_8_ = local_258;
  auVar4[0xf] = 0;
  alVar7 = (__m128i)psllw(auVar4,ZEXT416(uVar6));
  *blt_out = alVar7;
  uVar1 = *(undefined8 *)_limit0;
  uStack_107 = (undefined1)((ulong)uVar1 >> 8);
  uStack_106 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_105 = (undefined1)((ulong)uVar1 >> 0x18);
  local_258._0_2_ = (ushort)(byte)uVar1;
  local_258._0_3_ = CONCAT12(uStack_107,(ushort)local_258);
  local_258._0_4_ = (uint)(uint3)local_258;
  local_258._0_5_ = CONCAT14(uStack_106,(uint)local_258);
  local_258._0_6_ = (uint6)(uint5)local_258;
  local_258._0_7_ = CONCAT16(uStack_105,(uint6)local_258);
  local_258 = CONCAT17(0,(uint7)local_258);
  uVar1 = *(undefined8 *)_limit1;
  local_128 = (byte)uVar1;
  uStack_127 = (undefined1)((ulong)uVar1 >> 8);
  uStack_126 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_125 = (undefined1)((ulong)uVar1 >> 0x18);
  auVar3[9] = 0;
  auVar3[8] = local_128;
  auVar3[10] = uStack_127;
  auVar3[0xb] = 0;
  auVar3[0xc] = uStack_126;
  auVar3[0xd] = 0;
  auVar3[0xe] = uStack_125;
  auVar3._0_8_ = local_258;
  auVar3[0xf] = 0;
  alVar7 = (__m128i)psllw(auVar3,ZEXT416(uVar6));
  *lt_out = alVar7;
  uVar1 = *(undefined8 *)_thresh0;
  uStack_147 = (undefined1)((ulong)uVar1 >> 8);
  uStack_146 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_145 = (undefined1)((ulong)uVar1 >> 0x18);
  local_258._0_2_ = (ushort)(byte)uVar1;
  local_258._0_3_ = CONCAT12(uStack_147,(ushort)local_258);
  local_258._0_4_ = (uint)(uint3)local_258;
  local_258._0_5_ = CONCAT14(uStack_146,(uint)local_258);
  local_258._0_6_ = (uint6)(uint5)local_258;
  local_258._0_7_ = CONCAT16(uStack_145,(uint6)local_258);
  local_258 = CONCAT17(0,(uint7)local_258);
  uVar1 = *(undefined8 *)_thresh1;
  local_168 = (byte)uVar1;
  uStack_167 = (undefined1)((ulong)uVar1 >> 8);
  uStack_166 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_165 = (undefined1)((ulong)uVar1 >> 0x18);
  auVar2[9] = 0;
  auVar2[8] = local_168;
  auVar2[10] = uStack_167;
  auVar2[0xb] = 0;
  auVar2[0xc] = uStack_166;
  auVar2[0xd] = 0;
  auVar2[0xe] = uStack_165;
  auVar2._0_8_ = local_258;
  auVar2[0xf] = 0;
  alVar7 = (__m128i)psllw(auVar2,ZEXT416(uVar6));
  *thr_out = alVar7;
  uVar5 = (undefined2)(1 << ((char)bd - 1U & 0x1f));
  (*t80_out)[0] = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5)));
  (*t80_out)[1] = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5)));
  return;
}

Assistant:

static inline void get_limit_dual(
    const uint8_t *_blimit0, const uint8_t *_limit0, const uint8_t *_thresh0,
    const uint8_t *_blimit1, const uint8_t *_limit1, const uint8_t *_thresh1,
    int bd, __m128i *blt_out, __m128i *lt_out, __m128i *thr_out,
    __m128i *t80_out) {
  const int shift = bd - 8;
  const __m128i zero = _mm_setzero_si128();

  __m128i x0 =
      _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_blimit0), zero);
  __m128i x1 =
      _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_blimit1), zero);
  x0 = _mm_unpacklo_epi64(x0, x1);
  *blt_out = _mm_slli_epi16(x0, shift);

  x0 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_limit0), zero);
  x1 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_limit1), zero);
  x0 = _mm_unpacklo_epi64(x0, x1);
  *lt_out = _mm_slli_epi16(x0, shift);

  x0 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_thresh0), zero);
  x1 = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)_thresh1), zero);
  x0 = _mm_unpacklo_epi64(x0, x1);
  *thr_out = _mm_slli_epi16(x0, shift);

  *t80_out = _mm_set1_epi16(1 << (bd - 1));
}